

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

char __thiscall llvm::yaml::Scanner::scanBlockChompingIndicator(Scanner *this)

{
  char local_11;
  char Indicator;
  Scanner *this_local;
  
  local_11 = ' ';
  if ((this->Current != this->End) && ((*this->Current == '+' || (*this->Current == '-')))) {
    local_11 = *this->Current;
    skip(this,1);
  }
  return local_11;
}

Assistant:

char Scanner::scanBlockChompingIndicator() {
  char Indicator = ' ';
  if (Current != End && (*Current == '+' || *Current == '-')) {
    Indicator = *Current;
    skip(1);
  }
  return Indicator;
}